

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O2

void tchecker::dbm::zero(db_t *dbm,clock_id_t dim)

{
  bool bVar1;
  uint uVar2;
  clock_id_t i;
  clock_id_t cVar3;
  uint uVar4;
  ulong uVar5;
  char *__assertion;
  
  if (dbm == (db_t *)0x0) {
    __assertion = "dbm != nullptr";
    uVar2 = 0x48;
  }
  else if (dim == 0) {
    __assertion = "dim >= 1";
    uVar2 = 0x49;
  }
  else {
    uVar2 = 0;
    for (cVar3 = 0; uVar5 = (ulong)dim, uVar4 = uVar2, cVar3 != dim; cVar3 = cVar3 + 1) {
      while( true ) {
        bVar1 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar1) break;
        dbm[uVar4] = (db_t)0x1;
        uVar4 = uVar4 + 1;
      }
      uVar2 = uVar2 + dim;
    }
    bVar1 = is_consistent(dbm,dim);
    if (bVar1) {
      bVar1 = is_tight(dbm,dim);
      if (bVar1) {
        return;
      }
      __assertion = "tchecker::dbm::is_tight(dbm, dim)";
      uVar2 = 0x4e;
    }
    else {
      __assertion = "tchecker::dbm::is_consistent(dbm, dim)";
      uVar2 = 0x4d;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,uVar2,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
}

Assistant:

void zero(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::LE_ZERO;
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}